

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_Normalize3(UInt32 subValue,CLzRef *items,UInt32 numItems)

{
  CLzRef local_24;
  uint local_20;
  UInt32 value;
  UInt32 i;
  UInt32 numItems_local;
  CLzRef *items_local;
  UInt32 subValue_local;
  
  for (local_20 = 0; local_20 < numItems; local_20 = local_20 + 1) {
    if (subValue < items[local_20]) {
      local_24 = items[local_20] - subValue;
    }
    else {
      local_24 = 0;
    }
    items[local_20] = local_24;
  }
  return;
}

Assistant:

void MatchFinder_Normalize3(UInt32 subValue, CLzRef* items, UInt32 numItems) {
  UInt32 i;
  for (i = 0; i < numItems; i++) {
    UInt32 value = items[i];
    if (value <= subValue)
      value = kEmptyHashValue;
    else
      value -= subValue;
    items[i] = value;
  }
}